

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alf_exporter.cpp
# Opt level: O3

unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_> make_alf_file(fitting_result *data)

{
  long lVar1;
  uint uVar2;
  undefined4 *puVar3;
  ltc_store_data *plVar4;
  pointer *__ptr;
  uint angle;
  fitting_result *in_RSI;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  
  puVar3 = (undefined4 *)operator_new(0x40);
  *(undefined8 *)(puVar3 + 4) = 0;
  *(undefined8 *)(puVar3 + 6) = 0;
  *(undefined8 *)(puVar3 + 8) = 0;
  *(undefined8 *)(puVar3 + 10) = 0;
  *(undefined8 *)(puVar3 + 0xc) = 0;
  *(undefined8 *)(puVar3 + 0xe) = 0;
  *(undefined4 **)data = puVar3;
  *puVar3 = 0x464c41;
  uVar6 = in_RSI->num_samples_angle;
  puVar3[2] = uVar6;
  uVar7 = in_RSI->num_samples_roughness;
  puVar3[3] = uVar7;
  puVar3[1] = 1;
  iVar5 = uVar7 * uVar6;
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)(puVar3 + 4),(ulong)(uint)(iVar5 * 4));
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)(puVar3 + 10),(ulong)(uint)(iVar5 * 3));
  uVar6 = puVar3[2];
  if (uVar6 != 0) {
    uVar7 = puVar3[3];
    angle = 0;
    do {
      uVar2 = 0;
      if (uVar7 != 0) {
        uVar6 = 0;
        do {
          plVar4 = fitting_result::getData(in_RSI,angle,uVar6);
          iVar5 = uVar7 * angle + uVar6;
          uVar8 = (ulong)(uint)(iVar5 * 4);
          lVar1 = *(long *)(puVar3 + 4);
          *(float *)(lVar1 + uVar8 * 4) = (plVar4->matrix_parameters)._M_elems[0];
          *(float *)(lVar1 + 4 + uVar8 * 4) = (plVar4->matrix_parameters)._M_elems[1];
          *(float *)(lVar1 + 8 + uVar8 * 4) = (plVar4->matrix_parameters)._M_elems[2];
          *(float *)(lVar1 + 0xc + uVar8 * 4) = (plVar4->matrix_parameters)._M_elems[3];
          lVar1 = *(long *)(puVar3 + 10);
          *(float *)(lVar1 + (ulong)(uint)(iVar5 * 3) * 4) = (plVar4->matrix_parameters)._M_elems[4]
          ;
          *(float *)(lVar1 + (ulong)(iVar5 * 3 + 1) * 4) = plVar4->distribution_norm;
          *(float *)(lVar1 + (ulong)(iVar5 * 3 + 2) * 4) = plVar4->fresnel_term;
          uVar6 = uVar6 + 1;
          uVar7 = puVar3[3];
        } while (uVar6 < uVar7);
        uVar6 = puVar3[2];
        uVar2 = uVar7;
      }
      uVar7 = uVar2;
      angle = angle + 1;
    } while (angle < uVar6);
  }
  return (__uniq_ptr_data<alf::alf_file,_std::default_delete<alf::alf_file>,_true,_true>)
         (__uniq_ptr_data<alf::alf_file,_std::default_delete<alf::alf_file>,_true,_true>)data;
}

Assistant:

std::unique_ptr<alf::alf_file> make_alf_file(const fitting_result &data)
{
  auto file = std::make_unique<alf::alf_file>();

  std::strcpy(file->header.id, "ALF");
  file->header.num_samples_angle = data.num_samples_angle;
  file->header.num_samples_roughness = data.num_samples_roughness;
  file->header.version_major = 1;
  file->header.version_minor = 0;

  auto num_samples = file->header.num_samples_angle * file->header.num_samples_roughness;
  file->texture_slot1.resize(4 * num_samples);
  file->texture_slot2.resize(3 * num_samples);

  for (auto theta = 0; theta < file->header.num_samples_angle; ++theta)
  {
    for (auto alpha = 0; alpha < file->header.num_samples_roughness; ++alpha)
    {
      auto matrix_index = file->header.num_samples_roughness * theta + alpha;
      auto base_tex1 = 4 * matrix_index;
      auto base_tex2 = 3 * matrix_index;

      const auto& params = data.getData(theta, alpha);

      file->texture_slot1[base_tex1+0] = params.matrix_parameters[0];
      file->texture_slot1[base_tex1+1] = params.matrix_parameters[1];
      file->texture_slot1[base_tex1+2] = params.matrix_parameters[2];
      file->texture_slot1[base_tex1+3] = params.matrix_parameters[3];

      file->texture_slot2[base_tex2+0] = params.matrix_parameters[4];
      file->texture_slot2[base_tex2+1] = params.distribution_norm;
      file->texture_slot2[base_tex2+2] = params.fresnel_term;
    }
  }

  return file;
}